

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void emulator_set_builtin_palette(Emulator *e,u32 index)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int i;
  long lVar3;
  PaletteRGBA *pPVar4;
  int i_4;
  int i_5;
  PaletteRGBA *pPVar5;
  int i_1;
  long lVar6;
  
  if (index < 0x54) {
    uVar2 = *(undefined8 *)(emulator_set_builtin_palette::pals[index][0].color + 2);
    *(undefined8 *)e->color_to_rgba[0].color =
         *(undefined8 *)emulator_set_builtin_palette::pals[index][0].color;
    *(undefined8 *)(e->color_to_rgba[0].color + 2) = uVar2;
    lVar3 = 0;
    do {
      e->pal[0].color[lVar3] = e->color_to_rgba[0].color[(e->state).ppu.pal[0].color[lVar3]];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    pPVar4 = e->sgb_pal;
    lVar3 = 0;
    pPVar5 = pPVar4;
    do {
      lVar6 = 0;
      do {
        pPVar5->color[lVar6] =
             (e->state).sgb.screen_pal[lVar3].color[(e->state).ppu.pal[0].color[lVar6]];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      lVar3 = lVar3 + 1;
      pPVar5 = pPVar5 + 1;
    } while (lVar3 != 4);
    uVar2 = *(undefined8 *)(emulator_set_builtin_palette::pals[index][1].color + 2);
    *(undefined8 *)e->color_to_rgba[1].color =
         *(undefined8 *)emulator_set_builtin_palette::pals[index][1].color;
    *(undefined8 *)(e->color_to_rgba[1].color + 2) = uVar2;
    lVar3 = 0;
    do {
      e->pal[1].color[lVar3] = e->color_to_rgba[1].color[(e->state).ppu.pal[1].color[lVar3]];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    uVar2 = *(undefined8 *)(emulator_set_builtin_palette::pals[index][2].color + 2);
    *(undefined8 *)e->color_to_rgba[2].color =
         *(undefined8 *)emulator_set_builtin_palette::pals[index][2].color;
    *(undefined8 *)(e->color_to_rgba[2].color + 2) = uVar2;
    lVar3 = 0;
    do {
      e->sgb_pal[-1].color[lVar3] =
           e->pal[-1].color[*(uint *)((long)((e->state).ppu.bgcp.palettes + -1) + lVar3 * 4)];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    lVar3 = 0;
    do {
      uVar2 = *(undefined8 *)(emulator_set_builtin_palette::pals[index][0].color + 2);
      puVar1 = (undefined8 *)((long)(e->state).sgb.screen_pal[0].color + lVar3);
      *puVar1 = *(undefined8 *)emulator_set_builtin_palette::pals[index][0].color;
      puVar1[1] = uVar2;
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x40);
    lVar3 = 0;
    do {
      e->pal[0].color[lVar3] = e->color_to_rgba[0].color[(e->state).ppu.pal[0].color[lVar3]];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    lVar3 = 0;
    do {
      lVar6 = 0;
      do {
        pPVar4->color[lVar6] =
             (e->state).sgb.screen_pal[lVar3].color[(e->state).ppu.pal[0].color[lVar6]];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      lVar3 = lVar3 + 1;
      pPVar4 = pPVar4 + 1;
    } while (lVar3 != 4);
  }
  return;
}

Assistant:

void emulator_set_builtin_palette(Emulator* e, u32 index) {
  static const PaletteRGBA pals[][3] = {
#define PAL(b0, b1, b2, b3, o00, o01, o02, o03, o10, o11, o12, o13) \
  {{{b0, b1, b2, b3}}, {{o00, o01, o02, o03}}, {{o10, o11, o12, o13}}},
#define PAL3(c0, c1, c2, c3) \
  {{{c0, c1, c2, c3}}, {{c0, c1, c2, c3}}, {{c0, c1, c2, c3}}},
#include "builtin-palettes.def"
#undef PAL
#undef PAL3
  };
  size_t count = sizeof(pals) / sizeof(*pals);
  if (index >= count) { return; }
  emulator_set_bw_palette(e, 0, &pals[index][0]);
  emulator_set_bw_palette(e, 1, &pals[index][1]);
  emulator_set_bw_palette(e, 2, &pals[index][2]);
  for (int i = 0; i < 4; ++i) {
    SGB.screen_pal[i] = pals[index][0];
  }
  update_bw_palette_rgba(e, PALETTE_TYPE_BGP);
}